

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O2

char * __thiscall TadsHttpReqResult::next_header(TadsHttpReqResult *this,char *p)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = p + 2;
  do {
    if (pcVar2[-2] == '\r') {
      if (pcVar2[-1] == '\n') {
        while( true ) {
          if (*pcVar2 == L'\0') {
            return (char *)0x0;
          }
          iVar1 = is_space((int)*pcVar2);
          if (iVar1 == 0) break;
          pcVar2 = pcVar2 + 1;
        }
        if (*pcVar2 == '\0') {
          return (char *)0x0;
        }
        if (*pcVar2 != '\r') {
          return pcVar2;
        }
        if (pcVar2[1] == '\n') {
          return (char *)0x0;
        }
        return pcVar2;
      }
    }
    else if (pcVar2[-2] == '\0') {
      return (char *)0x0;
    }
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

const char *next_header(const char *p)
    {
        /* scan ahead to the next \r\n sequence */
        for ( ; *p != '\0' ; ++p)
        {
            /* if this is a CR-LF sequence, it's the end of this header */
            if (*p == '\r' && *(p+1) == '\n')
            {
                /* skip spaces */
                for (p += 2 ; *p != '\0' && is_space(*p) ; ++p) ;

                /* if this was a blank line, we're out of headers */
                if (*p == '\0' || (*p == '\r' && *(p+1) == '\n'))
                    return 0;

                /* this is the next header */
                return p;
            }
        }

        /* no more headers */
        return 0;
    }